

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_ECC_PARMS_Unmarshal(TPMS_ECC_PARMS *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_ECC_PARMS *target_local;
  
  target_local._4_4_ = TPMT_SYM_DEF_OBJECT_Unmarshal(&target->symmetric,buffer,size,1);
  if (((target_local._4_4_ == 0) &&
      (target_local._4_4_ = TPMT_ECC_SCHEME_Unmarshal(&target->scheme,buffer,size,1),
      target_local._4_4_ == 0)) &&
     (target_local._4_4_ = TPMI_ECC_CURVE_Unmarshal(&target->curveID,buffer,size),
     target_local._4_4_ == 0)) {
    target_local._4_4_ = TPMT_KDF_SCHEME_Unmarshal(&target->kdf,buffer,size,1);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_ECC_PARMS_Unmarshal(TPMS_ECC_PARMS *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPMT_SYM_DEF_OBJECT_Unmarshal((TPMT_SYM_DEF_OBJECT *)&(target->symmetric), buffer, size, 1);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMT_ECC_SCHEME_Unmarshal((TPMT_ECC_SCHEME *)&(target->scheme), buffer, size, 1);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_ECC_CURVE_Unmarshal((TPMI_ECC_CURVE *)&(target->curveID), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMT_KDF_SCHEME_Unmarshal((TPMT_KDF_SCHEME *)&(target->kdf), buffer, size, 1);
    return result;
}